

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

StackSym * __thiscall GlobOptBlockData::GetCopyPropSym(GlobOptBlockData *this,Sym *sym,Value *value)

{
  ValueInfo *this_00;
  Sym *this_01;
  code *pcVar1;
  bool bVar2;
  StackSym *pSVar3;
  undefined4 *puVar4;
  Value *pVVar5;
  
  this_00 = value->valueInfo;
  this_01 = this_00->symStore;
  if (((this_01 != (Sym *)0x0) && (this_01 != sym)) && (this_01->m_kind == SymKindStack)) {
    pSVar3 = Sym::AsStackSym(this_01);
    if ((pSVar3->field_0x1a & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                         ,0x5bf,"(!copySym->AsStackSym()->IsTypeSpec())",
                         "!copySym->AsStackSym()->IsTypeSpec()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    pVVar5 = FindValue(this,this_00->symStore);
    if ((pVVar5 != (Value *)0x0) && (pVVar5->valueNumber == value->valueNumber)) {
      bVar2 = ValueInfo::IsVarConstant(this_00);
      if ((bVar2) && (bVar2 = IsLive(this,this_01), !bVar2)) {
        return (StackSym *)0x0;
      }
      pSVar3 = Sym::AsStackSym(this_01);
      return pSVar3;
    }
  }
  return (StackSym *)0x0;
}

Assistant:

StackSym *
GlobOptBlockData::GetCopyPropSym(Sym * sym, Value * value)
{
    ValueInfo *valueInfo = value->GetValueInfo();
    Sym * copySym = valueInfo->GetSymStore();

    if (!copySym)
    {
        return nullptr;
    }

    // Only copy prop stackSym, as a propertySym wouldn't improve anything.
    // SingleDef info isn't flow sensitive, so make sure the symbol is actually live.
    if (copySym->IsStackSym() && copySym != sym)
    {
        Assert(!copySym->AsStackSym()->IsTypeSpec());
        Value *copySymVal = this->FindValue(valueInfo->GetSymStore());
        if (copySymVal && copySymVal->GetValueNumber() == value->GetValueNumber())
        {
            if (valueInfo->IsVarConstant() && !this->IsLive(copySym))
            {
                // Because the addrConstantToValueMap isn't flow-based, the symStore of
                // varConstants may not be live.
                return nullptr;
            }
            return copySym->AsStackSym();
        }
    }
    return nullptr;
}